

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst.c
# Opt level: O0

void av1_compute_stats_highbd_c
               (int wiener_win,uint8_t *dgd8,uint8_t *src8,int16_t *dgd_avg,int16_t *src_avg,
               int h_start,int h_end,int v_start,int v_end,int dgd_stride,int src_stride,int64_t *M,
               int64_t *H,aom_bit_depth_t bit_depth)

{
  ushort uVar1;
  uint16_t uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long in_RDX;
  long in_RSI;
  int in_EDI;
  int in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int idx;
  int32_t X;
  uint8_t bit_depth_divider;
  uint16_t avg;
  uint16_t *dgd;
  uint16_t *src;
  int wiener_halfwin;
  int wiener_win2;
  int32_t Y [49];
  int l;
  int k;
  int j;
  int i;
  int local_12c;
  byte local_123;
  int aiStack_108 [51];
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  
  iVar3 = in_EDI * in_EDI;
  iVar4 = in_EDI >> 1;
  local_2c = in_R9D;
  uVar2 = find_average_highbd((uint16_t *)(in_RSI * 2),in_R9D,in_stack_00000008,in_stack_00000010,
                              in_stack_00000018,X);
  local_123 = 1;
  if (Y[0] == 0xc) {
    local_123 = 0x10;
  }
  else if (Y[0] == 10) {
    local_123 = 4;
  }
  memset(src,0,(long)iVar3 << 3);
  memset(_wiener_halfwin,0,(long)iVar3 * 8 * (long)iVar3);
  for (local_30 = in_stack_00000010; local_30 < in_stack_00000018; local_30 = local_30 + 1) {
    for (local_34 = local_2c; local_34 < in_stack_00000008; local_34 = local_34 + 1) {
      uVar1 = *(ushort *)(in_RDX * 2 + (long)(local_30 * (int)dgd + local_34) * 2);
      local_12c = 0;
      for (local_38 = -iVar4; local_38 <= iVar4; local_38 = local_38 + 1) {
        for (local_3c = -iVar4; local_3c <= iVar4; local_3c = local_3c + 1) {
          aiStack_108[local_12c] =
               (uint)((uint16_t *)(in_RSI * 2))[(local_30 + local_3c) * X + local_34 + local_38] -
               (uint)uVar2;
          local_12c = local_12c + 1;
        }
      }
      for (local_38 = 0; local_38 < iVar3; local_38 = local_38 + 1) {
        *(long *)(src + (long)local_38 * 4) =
             (long)aiStack_108[local_38] * (long)(int)((uint)uVar1 - (uint)uVar2) +
             *(long *)(src + (long)local_38 * 4);
        for (local_3c = local_38; local_3c < iVar3; local_3c = local_3c + 1) {
          lVar5 = (long)(local_38 * iVar3 + local_3c);
          *(long *)((long)_wiener_halfwin + lVar5 * 8) =
               (long)aiStack_108[local_38] * (long)aiStack_108[local_3c] +
               *(long *)((long)_wiener_halfwin + lVar5 * 8);
        }
      }
    }
  }
  for (local_38 = 0; local_38 < iVar3; local_38 = local_38 + 1) {
    *(long *)(src + (long)local_38 * 4) =
         *(long *)(src + (long)local_38 * 4) / (long)(ulong)local_123;
    lVar5 = (long)(local_38 * iVar3 + local_38);
    *(long *)((long)_wiener_halfwin + lVar5 * 8) =
         *(long *)((long)_wiener_halfwin + lVar5 * 8) / (long)(ulong)local_123;
    local_3c = local_38;
    while (local_3c = local_3c + 1, local_3c < iVar3) {
      lVar5 = (long)(local_38 * iVar3 + local_3c);
      *(long *)((long)_wiener_halfwin + lVar5 * 8) =
           *(long *)((long)_wiener_halfwin + lVar5 * 8) / (long)(ulong)local_123;
      *(undefined8 *)((long)_wiener_halfwin + (long)(local_3c * iVar3 + local_38) * 8) =
           *(undefined8 *)((long)_wiener_halfwin + (long)(local_38 * iVar3 + local_3c) * 8);
    }
  }
  return;
}

Assistant:

void av1_compute_stats_highbd_c(int wiener_win, const uint8_t *dgd8,
                                const uint8_t *src8, int16_t *dgd_avg,
                                int16_t *src_avg, int h_start, int h_end,
                                int v_start, int v_end, int dgd_stride,
                                int src_stride, int64_t *M, int64_t *H,
                                aom_bit_depth_t bit_depth) {
  (void)dgd_avg;
  (void)src_avg;
  int i, j, k, l;
  int32_t Y[WIENER_WIN2];
  const int wiener_win2 = wiener_win * wiener_win;
  const int wiener_halfwin = (wiener_win >> 1);
  const uint16_t *src = CONVERT_TO_SHORTPTR(src8);
  const uint16_t *dgd = CONVERT_TO_SHORTPTR(dgd8);
  uint16_t avg =
      find_average_highbd(dgd, h_start, h_end, v_start, v_end, dgd_stride);

  uint8_t bit_depth_divider = 1;
  if (bit_depth == AOM_BITS_12)
    bit_depth_divider = 16;
  else if (bit_depth == AOM_BITS_10)
    bit_depth_divider = 4;

  memset(M, 0, sizeof(*M) * wiener_win2);
  memset(H, 0, sizeof(*H) * wiener_win2 * wiener_win2);
  for (i = v_start; i < v_end; i++) {
    for (j = h_start; j < h_end; j++) {
      const int32_t X = (int32_t)src[i * src_stride + j] - (int32_t)avg;
      int idx = 0;
      for (k = -wiener_halfwin; k <= wiener_halfwin; k++) {
        for (l = -wiener_halfwin; l <= wiener_halfwin; l++) {
          Y[idx] = (int32_t)dgd[(i + l) * dgd_stride + (j + k)] - (int32_t)avg;
          idx++;
        }
      }
      assert(idx == wiener_win2);
      for (k = 0; k < wiener_win2; ++k) {
        M[k] += (int64_t)Y[k] * X;
        for (l = k; l < wiener_win2; ++l) {
          // H is a symmetric matrix, so we only need to fill out the upper
          // triangle here. We can copy it down to the lower triangle outside
          // the (i, j) loops.
          H[k * wiener_win2 + l] += (int64_t)Y[k] * Y[l];
        }
      }
    }
  }
  for (k = 0; k < wiener_win2; ++k) {
    M[k] /= bit_depth_divider;
    H[k * wiener_win2 + k] /= bit_depth_divider;
    for (l = k + 1; l < wiener_win2; ++l) {
      H[k * wiener_win2 + l] /= bit_depth_divider;
      H[l * wiener_win2 + k] = H[k * wiener_win2 + l];
    }
  }
}